

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  byte bVar1;
  U32 UVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  U32 *pUVar6;
  U32 *pUVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  long lVar10;
  uint uVar11;
  BYTE *pInLoopLimit;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  byte bVar15;
  ulong *puVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  U32 UVar27;
  U32 *chainTable;
  ulong uVar28;
  ulong *puVar29;
  U32 *chainTable_1;
  ulong uVar30;
  BYTE *pStart;
  uint local_80;
  
  uVar17 = (ms->cParams).minMatch;
  if (uVar17 - 6 < 2) {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar24 = 1 << (bVar1 & 0x1f);
    pUVar3 = ms->chainTable;
    pBVar4 = (ms->window).base;
    uVar19 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar17 = (ms->window).lowLimit;
    uVar25 = (uint)((long)ip - (long)pBVar4);
    uVar22 = uVar25 - uVar19;
    if (uVar25 - uVar17 <= uVar19) {
      uVar22 = uVar17;
    }
    uVar19 = (ms->window).dictLimit;
    if (ms->loadedDictEnd != 0) {
      uVar22 = uVar17;
    }
    uVar17 = uVar25 - uVar24;
    if (uVar25 < uVar24) {
      uVar17 = 0;
    }
    uVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pZVar5 = ms->dictMatchState;
    lVar12 = *(long *)ip;
    uVar30 = (ulong)(lVar12 * -0x30e4432340650000) >>
             (0x42U - (char)(pZVar5->cParams).hashLog & 0x3f);
    pUVar6 = pZVar5->hashTable;
    bVar15 = 0x40 - (char)(ms->cParams).hashLog;
    pUVar7 = ms->hashTable;
    uVar26 = (ulong)ms->nextToUpdate;
    if (ms->nextToUpdate < uVar25) {
      do {
        uVar28 = (ulong)(*(long *)(pBVar4 + uVar26) * -0x30e4432340650000) >> (bVar15 & 0x3f);
        pUVar3[(uint)uVar26 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar28];
        pUVar7[uVar28] = (uint)uVar26;
        uVar26 = uVar26 + 1;
      } while (uVar26 < ((long)ip - (long)pBVar4 & 0xffffffffU));
    }
    ms->nextToUpdate = uVar25;
    uVar11 = pUVar7[(ulong)(lVar12 * -0x30e4432340650000) >> (bVar15 & 0x3f)];
    uVar28 = 3;
    if (uVar22 <= uVar11) {
      uVar26 = uVar28;
      do {
        puVar16 = (ulong *)(pBVar4 + uVar11);
        if (*(BYTE *)(uVar26 + (long)puVar16) == ip[uVar26]) {
          puVar29 = (ulong *)ip;
          if (ip < iLimit + -7) {
            if (*puVar16 == *(ulong *)ip) {
              lVar12 = (ulong)uVar11 + 8;
              lVar18 = 0;
              do {
                puVar29 = (ulong *)(ip + lVar18 + 8);
                if (iLimit + -7 <= puVar29) {
                  puVar16 = (ulong *)(pBVar4 + lVar18 + lVar12);
                  goto LAB_00206e44;
                }
                lVar10 = lVar18 + lVar12;
                lVar18 = lVar18 + 8;
              } while (*(ulong *)(pBVar4 + lVar10) == *puVar29);
              uVar14 = *puVar29 ^ *(ulong *)(pBVar4 + lVar10);
              uVar28 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (uVar28 >> 3 & 0x1fffffff) + lVar18;
            }
            else {
              uVar14 = *(ulong *)ip ^ *puVar16;
              uVar28 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = uVar28 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00206e44:
            if ((puVar29 < iLimit + -3) && ((int)*puVar16 == (int)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar29 < iLimit + -1) && ((short)*puVar16 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar29 < iLimit) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar16 == (char)*puVar29));
            }
            uVar28 = (long)puVar29 - (long)ip;
          }
          if ((uVar26 < uVar28) &&
             (*offsetPtr = (ulong)((uVar25 + 2) - uVar11), uVar26 = uVar28, ip + uVar28 == iLimit))
          break;
        }
        uVar28 = uVar26;
        if ((uVar11 <= uVar17) ||
           ((uVar20 = uVar20 - 1, uVar20 == 0 ||
            (uVar11 = pUVar3[uVar11 & uVar24 - 1], uVar26 = uVar28, uVar11 < uVar22)))) break;
      } while( true );
    }
    pBVar8 = (pZVar5->window).nextSrc;
    pBVar9 = (pZVar5->window).base;
    iVar21 = ((int)pBVar8 - (int)pBVar9) - uVar19;
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    uVar17 = 3;
    if (uVar20 < 3) {
      uVar17 = uVar20;
    }
    uVar22 = pUVar6[uVar30 * 4 + 3];
    pUVar3 = pZVar5->chainTable;
    if (uVar20 == 0) {
      uVar17 = 0;
    }
    else {
      uVar26 = 0;
      do {
        uVar24 = pUVar6[uVar30 * 4 + uVar26];
        if ((ulong)uVar24 == 0) {
          return uVar28;
        }
        if (*(int *)(pBVar9 + uVar24) == *(int *)ip) {
          sVar13 = ZSTD_count_2segments
                             (ip + 4,(BYTE *)((long)(pBVar9 + uVar24) + 4),iLimit,pBVar8,
                              pBVar4 + uVar19);
          uVar14 = sVar13 + 4;
          if ((uVar28 < uVar14) &&
             (*offsetPtr = (ulong)((uVar25 + 2 + iVar21) - uVar24), uVar28 = uVar14,
             ip + uVar14 == iLimit)) {
            return uVar14;
          }
        }
        uVar26 = uVar26 + 1;
      } while (uVar17 != uVar26);
    }
    uVar11 = uVar22 & 0xff;
    uVar24 = uVar20 - uVar17;
    if (uVar11 <= uVar20 - uVar17) {
      uVar24 = uVar11;
    }
    if (uVar24 != 0) {
      uVar26 = 0;
      do {
        uVar26 = uVar26 + 1;
      } while (uVar24 != uVar26);
      if (uVar24 != 0) {
        iVar23 = *(int *)ip;
        lVar12 = 0;
        do {
          uVar17 = pUVar3[(ulong)(uVar22 >> 8) + lVar12];
          if (*(int *)(pBVar9 + uVar17) == iVar23) {
            sVar13 = ZSTD_count_2segments
                               (ip + 4,pBVar9 + (ulong)uVar17 + 4,iLimit,pBVar8,pBVar4 + uVar19);
            uVar26 = sVar13 + 4;
            if ((uVar28 < uVar26) &&
               (*offsetPtr = (ulong)((uVar25 + iVar21 + 2) - uVar17), uVar28 = uVar26,
               ip + uVar26 == iLimit)) {
              return uVar26;
            }
          }
          lVar12 = lVar12 + 1;
        } while (uVar24 != (uint)lVar12);
      }
    }
  }
  else if (uVar17 == 5) {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar25 = 1 << (bVar1 & 0x1f);
    pBVar4 = (ms->window).base;
    uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar22 = (uint)((long)ip - (long)pBVar4);
    UVar27 = uVar22 - uVar17;
    if (uVar22 - UVar2 <= uVar17) {
      UVar27 = UVar2;
    }
    pUVar3 = ms->chainTable;
    if (ms->loadedDictEnd != 0) {
      UVar27 = UVar2;
    }
    uVar17 = uVar22 - uVar25;
    if (uVar22 < uVar25) {
      uVar17 = 0;
    }
    uVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    uVar19 = (ms->window).dictLimit;
    pZVar5 = ms->dictMatchState;
    lVar12 = *(long *)ip;
    uVar30 = (ulong)(lVar12 * -0x30e4432345000000) >>
             (0x42U - (char)(pZVar5->cParams).hashLog & 0x3f);
    pUVar6 = pZVar5->hashTable;
    bVar15 = 0x40 - (char)(ms->cParams).hashLog;
    pUVar7 = ms->hashTable;
    uVar26 = (ulong)ms->nextToUpdate;
    if (ms->nextToUpdate < uVar22) {
      do {
        uVar28 = (ulong)(*(long *)(pBVar4 + uVar26) * -0x30e4432345000000) >> (bVar15 & 0x3f);
        pUVar3[(uint)uVar26 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar28];
        pUVar7[uVar28] = (uint)uVar26;
        uVar26 = uVar26 + 1;
      } while (uVar26 < ((long)ip - (long)pBVar4 & 0xffffffffU));
    }
    ms->nextToUpdate = uVar22;
    uVar20 = pUVar7[(ulong)(lVar12 * -0x30e4432345000000) >> (bVar15 & 0x3f)];
    uVar28 = 3;
    if (UVar27 <= uVar20) {
      do {
        puVar16 = (ulong *)(pBVar4 + uVar20);
        if (*(BYTE *)(uVar28 + (long)puVar16) == ip[uVar28]) {
          puVar29 = (ulong *)ip;
          if (ip < iLimit + -7) {
            if (*puVar16 == *(ulong *)ip) {
              lVar12 = (ulong)uVar20 + 8;
              lVar18 = 0;
              do {
                puVar29 = (ulong *)(ip + lVar18 + 8);
                if (iLimit + -7 <= puVar29) {
                  puVar16 = (ulong *)(pBVar4 + lVar18 + lVar12);
                  goto LAB_002072f3;
                }
                lVar10 = lVar18 + lVar12;
                lVar18 = lVar18 + 8;
              } while (*(ulong *)(pBVar4 + lVar10) == *puVar29);
              uVar14 = *puVar29 ^ *(ulong *)(pBVar4 + lVar10);
              uVar26 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar26 = (uVar26 >> 3 & 0x1fffffff) + lVar18;
            }
            else {
              uVar14 = *(ulong *)ip ^ *puVar16;
              uVar26 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              uVar26 = uVar26 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_002072f3:
            if ((puVar29 < iLimit + -3) && ((int)*puVar16 == (int)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar29 < iLimit + -1) && ((short)*puVar16 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar29 < iLimit) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar16 == (char)*puVar29));
            }
            uVar26 = (long)puVar29 - (long)ip;
          }
          if ((uVar28 < uVar26) &&
             (*offsetPtr = (ulong)((uVar22 + 2) - uVar20), uVar28 = uVar26, ip + uVar26 == iLimit))
          break;
        }
        if ((uVar20 <= uVar17) ||
           ((uVar24 = uVar24 - 1, uVar24 == 0 ||
            (uVar20 = pUVar3[uVar20 & uVar25 - 1], uVar20 < UVar27)))) break;
      } while( true );
    }
    pBVar8 = (pZVar5->window).nextSrc;
    pBVar9 = (pZVar5->window).base;
    iVar21 = ((int)pBVar8 - (int)pBVar9) - uVar19;
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    uVar17 = 3;
    if (uVar24 < 3) {
      uVar17 = uVar24;
    }
    uVar25 = pUVar6[uVar30 * 4 + 3];
    pUVar3 = pZVar5->chainTable;
    if (uVar24 == 0) {
      uVar17 = 0;
    }
    else {
      uVar26 = 0;
      do {
        uVar20 = pUVar6[uVar30 * 4 + uVar26];
        if ((ulong)uVar20 == 0) {
          return uVar28;
        }
        if (*(int *)(pBVar9 + uVar20) == *(int *)ip) {
          sVar13 = ZSTD_count_2segments
                             (ip + 4,(BYTE *)((long)(pBVar9 + uVar20) + 4),iLimit,pBVar8,
                              pBVar4 + uVar19);
          uVar14 = sVar13 + 4;
          if ((uVar28 < uVar14) &&
             (*offsetPtr = (ulong)((uVar22 + 2 + iVar21) - uVar20), uVar28 = uVar14,
             ip + uVar14 == iLimit)) {
            return uVar14;
          }
        }
        uVar26 = uVar26 + 1;
      } while (uVar17 != uVar26);
    }
    uVar11 = uVar25 & 0xff;
    uVar20 = uVar24 - uVar17;
    if (uVar11 <= uVar24 - uVar17) {
      uVar20 = uVar11;
    }
    if (uVar20 != 0) {
      uVar26 = 0;
      do {
        uVar26 = uVar26 + 1;
      } while (uVar20 != uVar26);
      if (uVar20 != 0) {
        iVar23 = *(int *)ip;
        lVar12 = 0;
        do {
          uVar17 = pUVar3[(ulong)(uVar25 >> 8) + lVar12];
          if (*(int *)(pBVar9 + uVar17) == iVar23) {
            sVar13 = ZSTD_count_2segments
                               (ip + 4,pBVar9 + (ulong)uVar17 + 4,iLimit,pBVar8,pBVar4 + uVar19);
            uVar26 = sVar13 + 4;
            if ((uVar28 < uVar26) &&
               (*offsetPtr = (ulong)((iVar21 + uVar22 + 2) - uVar17), uVar28 = uVar26,
               ip + uVar26 == iLimit)) {
              return uVar26;
            }
          }
          lVar12 = lVar12 + 1;
        } while (uVar20 != (uint)lVar12);
      }
    }
  }
  else {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar22 = 1 << (bVar1 & 0x1f);
    pBVar4 = (ms->window).base;
    uVar17 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar25 = (uint)((long)ip - (long)pBVar4);
    UVar27 = uVar25 - uVar17;
    if (uVar25 - UVar2 <= uVar17) {
      UVar27 = UVar2;
    }
    pUVar3 = ms->chainTable;
    if (ms->loadedDictEnd != 0) {
      UVar27 = UVar2;
    }
    uVar17 = uVar25 - uVar22;
    if (uVar25 < uVar22) {
      uVar17 = 0;
    }
    local_80 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    uVar19 = (ms->window).dictLimit;
    pZVar5 = ms->dictMatchState;
    iVar21 = *(int *)ip;
    uVar24 = iVar21 * -0x61c8864f;
    uVar26 = (ulong)(uVar24 >> (0x22U - (char)(pZVar5->cParams).hashLog & 0x1f));
    pUVar6 = pZVar5->hashTable;
    bVar15 = 0x20 - (char)(ms->cParams).hashLog;
    pUVar7 = ms->hashTable;
    uVar28 = (ulong)ms->nextToUpdate;
    if (ms->nextToUpdate < uVar25) {
      do {
        uVar24 = (uint)(*(int *)(pBVar4 + uVar28) * -0x61c8864f) >> (bVar15 & 0x1f);
        pUVar3[(uint)uVar28 & ~(-1 << (bVar1 & 0x1f))] = pUVar7[uVar24];
        pUVar7[uVar24] = (uint)uVar28;
        uVar28 = uVar28 + 1;
      } while (uVar28 < ((long)ip - (long)pBVar4 & 0xffffffffU));
      iVar21 = *(int *)ip;
      uVar24 = iVar21 * -0x61c8864f;
    }
    ms->nextToUpdate = uVar25;
    uVar24 = pUVar7[uVar24 >> (bVar15 & 0x1f)];
    uVar28 = 3;
    if (UVar27 <= uVar24) {
      uVar30 = uVar28;
      do {
        puVar16 = (ulong *)(pBVar4 + uVar24);
        if (*(BYTE *)(uVar30 + (long)puVar16) == ip[uVar30]) {
          puVar29 = (ulong *)ip;
          if (ip < iLimit + -7) {
            if (*puVar16 == *(ulong *)ip) {
              lVar12 = (ulong)uVar24 + 8;
              lVar18 = 0;
              do {
                puVar29 = (ulong *)(ip + lVar18 + 8);
                if (iLimit + -7 <= puVar29) {
                  puVar16 = (ulong *)(pBVar4 + lVar18 + lVar12);
                  goto LAB_00207444;
                }
                lVar10 = lVar18 + lVar12;
                lVar18 = lVar18 + 8;
              } while (*(ulong *)(pBVar4 + lVar10) == *puVar29);
              uVar14 = *puVar29 ^ *(ulong *)(pBVar4 + lVar10);
              uVar28 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = (uVar28 >> 3 & 0x1fffffff) + lVar18;
            }
            else {
              uVar14 = *(ulong *)ip ^ *puVar16;
              uVar28 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
                }
              }
              uVar28 = uVar28 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00207444:
            if ((puVar29 < iLimit + -3) && ((int)*puVar16 == (int)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 4);
              puVar16 = (ulong *)((long)puVar16 + 4);
            }
            if ((puVar29 < iLimit + -1) && ((short)*puVar16 == (short)*puVar29)) {
              puVar29 = (ulong *)((long)puVar29 + 2);
              puVar16 = (ulong *)((long)puVar16 + 2);
            }
            if (puVar29 < iLimit) {
              puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar16 == (char)*puVar29));
            }
            uVar28 = (long)puVar29 - (long)ip;
          }
          if ((uVar30 < uVar28) &&
             (*offsetPtr = (ulong)((uVar25 + 2) - uVar24), uVar30 = uVar28, ip + uVar28 == iLimit))
          break;
        }
        uVar28 = uVar30;
        if ((uVar24 <= uVar17) ||
           ((local_80 = local_80 - 1, local_80 == 0 ||
            (uVar24 = pUVar3[uVar24 & uVar22 - 1], uVar30 = uVar28, uVar24 < UVar27)))) break;
      } while( true );
    }
    pBVar8 = (pZVar5->window).nextSrc;
    pBVar9 = (pZVar5->window).base;
    iVar23 = ((int)pBVar8 - (int)pBVar9) - uVar19;
    lVar12 = 0;
    do {
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    uVar17 = 3;
    if (local_80 < 3) {
      uVar17 = local_80;
    }
    uVar22 = pUVar6[uVar26 * 4 + 3];
    pUVar3 = pZVar5->chainTable;
    if (local_80 == 0) {
      uVar17 = 0;
    }
    else {
      uVar30 = 0;
      do {
        uVar24 = pUVar6[uVar26 * 4 + uVar30];
        if ((ulong)uVar24 == 0) {
          return uVar28;
        }
        if (*(int *)(pBVar9 + uVar24) == iVar21) {
          sVar13 = ZSTD_count_2segments
                             (ip + 4,(BYTE *)((long)(pBVar9 + uVar24) + 4),iLimit,pBVar8,
                              pBVar4 + uVar19);
          uVar14 = sVar13 + 4;
          if ((uVar28 < uVar14) &&
             (*offsetPtr = (ulong)((uVar25 + 2 + iVar23) - uVar24), uVar28 = uVar14,
             ip + uVar14 == iLimit)) {
            return uVar14;
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar17 != uVar30);
    }
    uVar20 = uVar22 & 0xff;
    uVar24 = local_80 - uVar17;
    if (uVar20 <= local_80 - uVar17) {
      uVar24 = uVar20;
    }
    if (uVar24 != 0) {
      uVar26 = 0;
      do {
        uVar26 = uVar26 + 1;
      } while (uVar24 != uVar26);
      if (uVar24 != 0) {
        lVar12 = 0;
        do {
          uVar17 = pUVar3[(ulong)(uVar22 >> 8) + lVar12];
          if (*(int *)(pBVar9 + uVar17) == iVar21) {
            sVar13 = ZSTD_count_2segments
                               (ip + 4,pBVar9 + (ulong)uVar17 + 4,iLimit,pBVar8,pBVar4 + uVar19);
            uVar26 = sVar13 + 4;
            if ((uVar28 < uVar26) &&
               (*offsetPtr = (ulong)((uVar25 + iVar23 + 2) - uVar17), uVar28 = uVar26,
               ip + uVar26 == iLimit)) {
              return uVar26;
            }
          }
          lVar12 = lVar12 + 1;
        } while (uVar24 != (uint)lVar12);
      }
    }
  }
  return uVar28;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dedicatedDictSearch_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dedicatedDictSearch);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dedicatedDictSearch);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dedicatedDictSearch);
    }
}